

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O3

Tree flutes_c(int d,int *xs,int *ys,int *s,int acc)

{
  dl_el_s **ppdVar1;
  dl_el *pdVar2;
  dl_t paVar3;
  int iVar4;
  Tree TVar5;
  int iVar6;
  dl_el *pdVar7;
  Branch *pBVar8;
  dl_el_s *pdVar9;
  dl_el_s *pdVar10;
  long lVar11;
  ulong uVar12;
  dl_el *pdVar13;
  int *piVar14;
  Tree TVar15;
  
  pdVar2 = ht[d]->first;
  if (pdVar2 != (dl_el *)0x0) {
    pdVar13 = pdVar2;
    do {
      pdVar9 = pdVar13[1].next;
      pdVar7 = pdVar2;
      if (d < 1) {
LAB_00127336:
        pdVar10 = pdVar7[1].prev;
        iVar4 = d * 2;
        pBVar8 = (Branch *)malloc((long)iVar4 * 0xc - 0x18);
        TVar5.branch = pBVar8;
        TVar5._0_8_ = pdVar10;
        TVar15.branch = pBVar8;
        TVar15._0_8_ = pdVar10;
        if (d < 2) {
          return TVar15;
        }
        iVar6 = iVar4 + -2;
        lVar11 = (ulong)(iVar4 - 4) * 0xc + 0xc;
        do {
          *(undefined4 *)((long)&pBVar8->n + lVar11) = *(undefined4 *)((long)&pdVar9->next + lVar11)
          ;
          *(undefined8 *)((long)&pBVar8->x + lVar11) = *(undefined8 *)((long)&pdVar9->prev + lVar11)
          ;
          iVar6 = iVar6 + -1;
          lVar11 = lVar11 + -0xc;
        } while (0 < iVar6);
        return TVar5;
      }
      ppdVar1 = &pdVar13->next;
      piVar14 = (int *)((long)&pdVar9->prev + 4);
      uVar12 = 0;
      while ((*piVar14 == ys[uVar12] && (piVar14[-1] == xs[s[uVar12]]))) {
        uVar12 = uVar12 + 1;
        piVar14 = piVar14 + 3;
        pdVar7 = pdVar13;
        if ((uint)d == uVar12) goto LAB_00127336;
      }
      pdVar13 = *ppdVar1;
    } while (*ppdVar1 != (dl_el_s *)0x0);
  }
  if (d < 10) {
    TVar15 = flutes_LD(d,xs,ys,s);
  }
  else {
    TVar15 = flutes_MD(d,xs,ys,s,acc);
  }
  iVar4 = d * 2;
  pdVar9 = (dl_el_s *)malloc((long)iVar4 * 0xc - 0x18);
  if (1 < d) {
    iVar6 = iVar4 + -2;
    lVar11 = (ulong)(iVar4 - 4) * 0xc + 0xc;
    do {
      *(undefined4 *)((long)&pdVar9->next + lVar11) =
           *(undefined4 *)((long)&(TVar15.branch)->n + lVar11);
      *(undefined8 *)((long)&pdVar9->prev + lVar11) =
           *(undefined8 *)((long)&(TVar15.branch)->x + lVar11);
      iVar6 = iVar6 + -1;
      lVar11 = lVar11 + -0xc;
    } while (0 < iVar6);
  }
  pdVar10 = (dl_el_s *)malloc(0x20);
  if (pdVar10 == (dl_el_s *)0x0) {
    puts("Out of memory!!");
  }
  else {
    pdVar10[1].prev = TVar15._0_8_;
    pdVar10[1].next = pdVar9;
    pdVar10->prev = (dl_el_s *)0x0;
    paVar3 = ht[d];
    if (paVar3->count == 0) {
      pdVar10->next = (dl_el_s *)0x0;
      paVar3->last = pdVar10;
      ht[d]->first = pdVar10;
      ht[d]->count = 1;
    }
    else {
      pdVar2 = paVar3->first;
      pdVar10->next = pdVar2;
      pdVar2->prev = pdVar10;
      ht[d]->first = pdVar10;
      ht[d]->count = ht[d]->count + 1;
    }
  }
  return TVar15;
}

Assistant:

Tree flutes_c(int d, DTYPE *xs, DTYPE *ys, int *s, int acc)
{
  int i;
  //int orig_ht_flag;
  Tree t, tdup;

#if USE_HASHING
  dl_forall(Tree, ht[d], t) {
    for (i=0; i<d; i++) {
      if (t.branch[i].y != ys[i] || t.branch[i].x != xs[s[i]]) {
	break;
      }
    }
    if (i >= d) { // found a match
      tdup = t;
      tdup.branch = (Branch*)malloc(sizeof(Branch)*(2*d-2));
      for (i=2*d-3; i>=0; i--) {
	tdup.branch[i] = t.branch[i];
      }
      return tdup;
    }
  } dl_endfor;

  //orig_ht_flag = new_ht;
  //new_ht = 0;
#endif

  t = flutes_LMD(d, xs, ys, s, acc);

#if USE_HASHING
  //new_ht = orig_ht_flag;
      
  tdup = t;
  tdup.branch = (Branch*)malloc(sizeof(Branch)*(2*d-2));
  for (i=2*d-3; i>=0; i--) {
    tdup.branch[i] = t.branch[i];
  }
  dl_prepend(Tree, ht[d], tdup);
#endif  

  return t;
}